

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O0

bool lua_sj_set_device(char *id,aint ramtop)

{
  bool bVar1;
  int to_remove;
  reference pvVar2;
  bool result;
  int positionsAdded;
  aint ramtop_local;
  char *id_local;
  
  to_remove = addLuaSourcePositions();
  deviceDirectivesCount = deviceDirectivesCount + 1;
  if (deviceDirectivesCount == 1) {
    bVar1 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::empty(&sourcePosStack);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!sourcePosStack.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/lua_sjasm.cpp"
                    ,0x147,"bool lua_sj_set_device(const char *, const aint)");
    }
    pvVar2 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
    globalDeviceSourcePos.filename = pvVar2->filename;
    globalDeviceSourcePos.line = pvVar2->line;
    globalDeviceSourcePos.colBegin = pvVar2->colBegin;
    globalDeviceSourcePos.colEnd = pvVar2->colEnd;
  }
  bVar1 = SetDevice(id,ramtop);
  removeLuaSourcePositions(to_remove);
  return bVar1;
}

Assistant:

static bool lua_sj_set_device(const char* id, const aint ramtop = 0) {
	int positionsAdded = addLuaSourcePositions();	// add known script positions to sourcePosStack vector
	// refresh source position of first DEVICE directive (to make global-device detection work correctly)
	if (1 == ++deviceDirectivesCount) {
		assert(!sourcePosStack.empty());
		globalDeviceSourcePos = sourcePosStack.back();
	}
	// check for nullptr id??
	bool result = SetDevice(id, ramtop);
	removeLuaSourcePositions(positionsAdded);
	return result;
}